

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t buffersize,CURLcode *curlcode)

{
  uint err_00;
  connectdata *conn_00;
  void *pvVar1;
  long lVar2;
  int iVar3;
  ulong error;
  uint *puVar4;
  char *pcVar5;
  int local_174;
  int sockerr;
  int err;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  connectdata *conn;
  long lStack_148;
  int buffsize;
  ssize_t nread;
  unsigned_long sslerror;
  char error_buffer [256];
  CURLcode *curlcode_local;
  size_t buffersize_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  conn_00 = cf->conn;
  pvVar1 = cf->ctx;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  ERR_clear_error();
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  if (buffersize < 0x80000000) {
    local_174 = (int)buffersize;
  }
  else {
    local_174 = 0x7fffffff;
  }
  iVar3 = SSL_read(*(SSL **)(lVar2 + 8),buf,local_174);
  lStack_148 = (long)iVar3;
  if (lStack_148 < 1) {
    iVar3 = SSL_get_error(*(SSL **)(lVar2 + 8),iVar3);
    switch(iVar3) {
    case 0:
      break;
    default:
      if (*(int *)(lVar2 + 0x20) == 0x51) {
        *curlcode = CURLE_AGAIN;
        lStack_148 = -1;
      }
      else {
        error = ERR_get_error();
        if ((lStack_148 < 0) || (error != 0)) {
          puVar4 = (uint *)__errno_location();
          err_00 = *puVar4;
          if (error == 0) {
            if ((err_00 == 0) || (iVar3 != 5)) {
              pcVar5 = SSL_ERROR_to_str(iVar3);
              curl_msnprintf((char *)&sslerror,0x100,"%s",pcVar5);
            }
            else {
              Curl_strerror(err_00,(char *)&sslerror,0x100);
            }
          }
          else {
            ossl_strerror(error,(char *)&sslerror,0x100);
          }
          Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",&sslerror,(ulong)err_00);
          *curlcode = CURLE_RECV_ERROR;
          lStack_148 = -1;
        }
      }
      break;
    case 2:
      *curlcode = CURLE_AGAIN;
      lStack_148 = -1;
      break;
    case 3:
      *(undefined4 *)((long)pvVar1 + 0x58) = 2;
      *curlcode = CURLE_AGAIN;
      lStack_148 = -1;
      break;
    case 6:
      if (cf->sockindex == 0) {
        Curl_conncontrol(conn_00,1);
      }
    }
  }
  return lStack_148;
}

Assistant:

static ssize_t ossl_recv(struct Curl_cfilter *cf,
                         struct Curl_easy *data,   /* transfer */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  struct connectdata *conn = cf->conn;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  ERR_clear_error();

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  nread = (ssize_t)SSL_read(octx->ssl, buf, buffsize);

  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(octx->ssl, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
      break;
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      /* close_notify alert */
      if(cf->sockindex == FIRSTSOCKET)
        /* mark the connection for close if it is indeed the control
           connection */
        connclose(conn, "TLS close_notify");
      break;
    case SSL_ERROR_WANT_READ:
      *curlcode = CURLE_AGAIN;
      nread = -1;
      goto out;
    case SSL_ERROR_WANT_WRITE:
      connssl->io_need = CURL_SSL_IO_NEED_SEND;
      *curlcode = CURLE_AGAIN;
      nread = -1;
      goto out;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://docs.openssl.org/master/man3/ERR_get_error/ */
      if(octx->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        nread = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        int sockerr = SOCKERRNO;
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr && err == SSL_ERROR_SYSCALL)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else
          msnprintf(error_buffer, sizeof(error_buffer), "%s",
                    SSL_ERROR_to_str(err));
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
      /* For debug builds be a little stricter and error on any
         SSL_ERROR_SYSCALL. For example a server may have closed the connection
         abruptly without a close_notify alert. For compatibility with older
         peers we do not do this by default. #4624

         We can use this to gauge how many users may be affected, and
         if it goes ok eventually transition to allow in dev and release with
         the newest OpenSSL: #if (OPENSSL_VERSION_NUMBER >= 0x10101000L) */
#ifdef DEBUGBUILD
      if(err == SSL_ERROR_SYSCALL) {
        int sockerr = SOCKERRNO;
        if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          msnprintf(error_buffer, sizeof(error_buffer),
                    "Connection closed abruptly");
        }
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d"
              " (Fatal because this is a curl debug build)",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
#endif
    }
  }

out:
  return nread;
}